

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool ScanBoolean(ConfigScanner *sc)

{
  int iVar1;
  char *__s1;
  long in_RDI;
  char *str;
  _Bool result;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var2;
  
  if (in_RDI == 0) {
    _Var2 = false;
  }
  else {
    __s1 = GetString((ConfigScanner *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8))
    ;
    if (__s1 == (char *)0x0) {
      _Var2 = false;
    }
    else {
      iVar1 = strcmp(__s1,"true");
      if (iVar1 == 0) {
        *(undefined1 *)(in_RDI + 0x50) = 1;
        *(undefined4 *)(in_RDI + 0x38) = 2;
        _Var2 = true;
      }
      else {
        iVar1 = strcmp(__s1,"false");
        _Var2 = iVar1 == 0;
        if (_Var2) {
          *(undefined1 *)(in_RDI + 0x50) = 0;
          *(undefined4 *)(in_RDI + 0x38) = 2;
        }
      }
      free(__s1);
    }
  }
  return _Var2;
}

Assistant:

bool ScanBoolean(ConfigScanner *sc)
{
	bool result = false;
	if (sc == NULL)
	{
		return result;
	}
	char *str = GetString(sc);
	if (str == NULL)
	{
		return result;
	}
	if (strcmp(str, "true") == 0)
	{
		sc->current_boolean = true;
		sc->vtype = VTYPE_BOOLEAN;
		result = true;
	}
	else if (strcmp(str, "false") == 0)
	{
		sc->current_boolean = false;
		sc->vtype = VTYPE_BOOLEAN;
		result = true;
	}
	free(str);
	return result;
}